

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_dump.h
# Opt level: O3

void dumpToken(KonohaContext *kctx,kToken *tk,int n)

{
  uint uVar1;
  _func_int_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  kArray *pkVar2;
  undefined8 uVar3;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var4;
  char *pcVar5;
  undefined8 uVar6;
  kString *pkVar7;
  uintptr_t uVar8;
  ulong uVar9;
  
  if (verbose_sugar == 0) {
    return;
  }
  if (n < 0) {
    n = (int)(short)tk->uline;
  }
  UNRECOVERED_JUMPTABLE = kctx->platApi->printf_i;
  pcVar5 = kToken_t(kctx,tk);
  pkVar2 = kctx->share->symbolList;
  uVar9 = (ulong)((tk->field_3).tokenType & 0xfffffff);
  if (uVar9 < pkVar2->bytesize >> 3) {
    uVar3 = *(undefined8 *)
             (KSymbol_prefixText_prefixes + (ulong)((tk->field_3).tokenType >> 0x1d) * 8);
    uVar6 = (**(code **)(*(long *)((pkVar2->field_2).unboxItems[uVar9] + 8) + 0x20))(kctx);
    (*UNRECOVERED_JUMPTABLE)("Token[%d] \'%s\' TokenType=%s%s",(ulong)(uint)n,pcVar5,uVar3,uVar6);
    if ((tk->field_3).tokenType == 0xe0000001) {
      (*kctx->platApi->printf_i)(" indent=+%d",(ulong)(tk->field_4).indent);
    }
    uVar1 = tk->symbol;
    if (uVar1 != 0) {
      pkVar2 = kctx->share->symbolList;
      if (pkVar2->bytesize >> 3 <= (ulong)(uVar1 & 0xfffffff)) goto LAB_0010fc30;
      uVar3 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(uVar1 >> 0x1d) * 8);
      UNRECOVERED_JUMPTABLE = kctx->platApi->printf_i;
      uVar6 = (**(code **)(*(long *)((pkVar2->field_2).unboxItems[uVar1 & 0xfffffff] + 8) + 0x20))
                        (kctx);
      (*UNRECOVERED_JUMPTABLE)(" Symbol=%s%s",uVar3,uVar6);
    }
    if ((tk->resolvedSyntaxInfo == (kSyntax *)0x0) ||
       (tk->resolvedSyntaxInfo->keyword != 0xe0000006)) {
      uVar1 = (tk->field_6).resolvedTypeId;
      if (uVar1 != 0) {
        pkVar2 = kctx->share->symbolList;
        if (pkVar2->bytesize >> 3 <= (ulong)(uVar1 & 0xfffffff)) goto LAB_0010fc30;
        uVar3 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(uVar1 >> 0x1d) * 8);
        UNRECOVERED_JUMPTABLE = kctx->platApi->printf_i;
        uVar6 = (**(code **)(*(long *)((pkVar2->field_2).unboxItems[uVar1 & 0xfffffff] + 8) + 0x20))
                          (kctx);
        (*UNRECOVERED_JUMPTABLE)(" ruleNameSymbol=%s%s",uVar3,uVar6);
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = kctx->platApi->printf_i;
      pkVar7 = KType_GetString(kctx,(tk->field_6).resolvedTypeId & 0xfffffff);
      p_Var4 = ((pkVar7->h).ct)->unbox;
      pkVar7 = KType_GetString(kctx,(tk->field_6).resolvedTypeId & 0xfffffff);
      uVar8 = (*p_Var4)(kctx,(kObject_conflict *)pkVar7);
      (*UNRECOVERED_JUMPTABLE)(" resolvedType=%s",uVar8);
    }
    if (tk->resolvedSyntaxInfo == (kSyntax *)0x0) {
      (*kctx->platApi->printf_i)(" Syntax=NULL\n");
      return;
    }
    uVar1 = tk->resolvedSyntaxInfo->keyword;
    pkVar2 = kctx->share->symbolList;
    uVar9 = (ulong)(uVar1 & 0xfffffff);
    if (uVar9 < pkVar2->bytesize >> 3) {
      uVar3 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(uVar1 >> 0x1d) * 8);
      UNRECOVERED_JUMPTABLE = kctx->platApi->printf_i;
      uVar6 = (**(code **)(*(long *)((pkVar2->field_2).unboxItems[uVar9] + 8) + 0x20))(kctx);
      (*UNRECOVERED_JUMPTABLE)(" Syntax=%s%s\n",uVar3,uVar6,UNRECOVERED_JUMPTABLE);
      return;
    }
  }
LAB_0010fc30:
  __assert_fail("index < (((kctx->share->symbolList)->bytesize)/sizeof(void *))",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/include/konoha3/klib.h"
                ,0x54,"kString *KSymbol_GetString(KonohaContext *, ksymbol_t)");
}

Assistant:

static void dumpToken(KonohaContext *kctx, kToken *tk, int n)
{
	if(verbose_sugar) {
		if(n < 0) n = (short) tk->uline;
		DUMP_P("Token[%d] '%s' TokenType=%s%s", n, KToken_t(tk), KSymbol_Fmt2(tk->tokenType));
		if(kToken_IsIndent(tk)) {
			DUMP_P(" indent=+%d", tk->indent);
		}
		if(tk->symbol > 0) {
			DUMP_P(" Symbol=%s%s", KSymbol_Fmt2(tk->symbol));
		}
		if(tk->resolvedSyntaxInfo != NULL && tk->resolvedSyntaxInfo->keyword == KSymbol_TypePattern) {
			DUMP_P(" resolvedType=%s", KType_text(tk->resolvedTypeId));
		}else {
			if(tk->ruleNameSymbol > 0) {
				DUMP_P(" ruleNameSymbol=%s%s", KSymbol_Fmt2(tk->ruleNameSymbol));
			}
		}
		if(tk->resolvedSyntaxInfo == NULL) {
			DUMP_P(" Syntax=NULL\n");
		}
		else {
			DUMP_P(" Syntax=%s%s\n", KSymbol_Fmt2(tk->resolvedSyntaxInfo->keyword));
		}
	}
}